

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void map_delete_record(JSRuntime *rt,JSMapState *s,JSMapRecord *mr)

{
  list_head *plVar1;
  list_head *plVar2;
  
  if (mr->empty != 0) {
    return;
  }
  plVar1 = (mr->hash_link).prev;
  plVar2 = (mr->hash_link).next;
  plVar1->next = plVar2;
  plVar2->prev = plVar1;
  (mr->hash_link).prev = (list_head *)0x0;
  (mr->hash_link).next = (list_head *)0x0;
  if (s->is_weak == 0) {
    JS_FreeValueRT(rt,mr->key);
  }
  else {
    delete_weak_ref((JSRuntime *)mr,(JSMapRecord *)s);
  }
  JS_FreeValueRT(rt,mr->value);
  mr->ref_count = mr->ref_count + -1;
  if (mr->ref_count == 0) {
    plVar1 = (mr->link).prev;
    plVar2 = (mr->link).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (mr->link).prev = (list_head *)0x0;
    (mr->link).next = (list_head *)0x0;
    (*(rt->mf).js_free)(&rt->malloc_state,mr);
  }
  else {
    mr->empty = 1;
    (mr->key).u.int32 = 0;
    (mr->key).tag = 3;
    (mr->value).u.int32 = 0;
    (mr->value).tag = 3;
  }
  s->record_count = s->record_count - 1;
  return;
}

Assistant:

static void map_delete_record(JSRuntime *rt, JSMapState *s, JSMapRecord *mr)
{
    if (mr->empty)
        return;
    list_del(&mr->hash_link);
    if (s->is_weak) {
        delete_weak_ref(rt, mr);
    } else {
        JS_FreeValueRT(rt, mr->key);
    }
    JS_FreeValueRT(rt, mr->value);
    if (--mr->ref_count == 0) {
        list_del(&mr->link);
        js_free_rt(rt, mr);
    } else {
        /* keep a zombie record for iterators */
        mr->empty = TRUE;
        mr->key = JS_UNDEFINED;
        mr->value = JS_UNDEFINED;
    }
    s->record_count--;
}